

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

uint aiGetMaterialTextureCount(aiMaterial *pMat,aiTextureType type)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *paVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (pMat == (aiMaterial *)0x0) {
    __assert_fail("pMat != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x148,"unsigned int aiGetMaterialTextureCount(const aiMaterial *, aiTextureType)"
                 );
  }
  uVar1 = pMat->mNumProperties;
  if ((ulong)uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    ppaVar2 = pMat->mProperties;
    uVar7 = 0;
    uVar6 = 0;
    do {
      paVar3 = ppaVar2[uVar7];
      if ((((paVar3 != (aiMaterialProperty *)0x0) &&
           (iVar4 = strcmp((paVar3->mKey).data,"$tex.file"), iVar4 == 0)) &&
          (paVar3->mSemantic == type)) && (uVar5 = paVar3->mIndex + 1, uVar6 <= uVar5)) {
        uVar6 = uVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return uVar6;
}

Assistant:

unsigned int aiGetMaterialTextureCount(const C_STRUCT aiMaterial* pMat,
    C_ENUM aiTextureType type)
{
    ai_assert (pMat != NULL);

    // Textures are always stored with ascending indices (ValidateDS provides a check, so we don't need to do it again)
    unsigned int max = 0;
    for (unsigned int i = 0; i < pMat->mNumProperties;++i) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if ( prop /* just a sanity check ... */
            && 0 == strcmp( prop->mKey.data, _AI_MATKEY_TEXTURE_BASE )
            && prop->mSemantic == type) {

            max = std::max(max,prop->mIndex+1);
        }
    }
    return max;
}